

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_callback_helper.h
# Opt level: O2

bool __thiscall
miniros::
ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::EmptyRequest_<std::allocator<void>_>,_roscpp::EmptyResponse_<std::allocator<void>_>_>_>
::call(ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::EmptyRequest_<std::allocator<void>_>,_roscpp::EmptyResponse_<std::allocator<void>_>_>_>
       *this,ServiceCallbackHelperCallParams *params)

{
  bool bVar1;
  EmptyResponse_<std::allocator<void>_> *in_RCX;
  ResponsePtr res;
  RequestPtr req;
  ServiceSpecCallParams<roscpp::EmptyRequest_<std::allocator<void>_>,_roscpp::EmptyResponse_<std::allocator<void>_>_>
  call_params;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ServiceSpecCallParams<roscpp::EmptyRequest_<std::allocator<void>_>,_roscpp::EmptyResponse_<std::allocator<void>_>_>
  local_98;
  SerializedMessage local_68;
  
  std::function<std::shared_ptr<roscpp::EmptyRequest_<std::allocator<void>_>_>_()>::operator()
            ((function<std::shared_ptr<roscpp::EmptyRequest_<std::allocator<void>_>_>_()> *)local_a8
            );
  std::function<std::shared_ptr<roscpp::EmptyResponse_<std::allocator<void>_>_>_()>::operator()
            ((function<std::shared_ptr<roscpp::EmptyResponse_<std::allocator<void>_>_>_()> *)
             local_b8);
  local_98.connection_header.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_98.connection_header.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.response.
  super___shared_ptr<roscpp::EmptyResponse_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_98.response.
  super___shared_ptr<roscpp::EmptyResponse_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.request.
  super___shared_ptr<roscpp::EmptyRequest_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_98.request.
  super___shared_ptr<roscpp::EmptyRequest_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<roscpp::EmptyRequest_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<roscpp::EmptyRequest_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
             *)&local_98,
            (__shared_ptr<roscpp::EmptyRequest_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
             *)local_a8);
  std::__shared_ptr<roscpp::EmptyResponse_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&local_98.response.
             super___shared_ptr<roscpp::EmptyResponse_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
            ,(__shared_ptr<roscpp::EmptyResponse_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
              *)local_b8);
  std::
  __shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&local_98.connection_header.
               super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&(params->connection_header).
                super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             );
  bVar1 = ServiceSpec<roscpp::EmptyRequest_<std::allocator<void>_>,_roscpp::EmptyResponse_<std::allocator<void>_>_>
          ::call(&this->callback_,&local_98);
  serialization::serializeServiceResponse<roscpp::EmptyResponse_<std::allocator<void>>>
            (&local_68,(serialization *)(ulong)bVar1,(bool)local_b8[0],in_RCX);
  SerializedMessage::operator=(&params->response,&local_68);
  SerializedMessage::~SerializedMessage(&local_68);
  ServiceSpecCallParams<roscpp::EmptyRequest_<std::allocator<void>_>,_roscpp::EmptyResponse_<std::allocator<void>_>_>
  ::~ServiceSpecCallParams(&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  return bVar1;
}

Assistant:

virtual bool call(ServiceCallbackHelperCallParams& params)
  {
    namespace ser = serialization;
    RequestPtr req(create_req_());
    ResponsePtr res(create_res_());

    ser::deserializeMessage(params.request, *req);

    ServiceSpecCallParams<RequestType, ResponseType> call_params;
    call_params.request = req;
    call_params.response = res;
    call_params.connection_header = params.connection_header;
    bool ok = Spec::call(callback_, call_params);
    params.response = ser::serializeServiceResponse(ok, *res);
    return ok;
  }